

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_no_parse.cpp
# Opt level: O0

void TestMADPconstructors(Arguments *args)

{
  MultiAgentDecisionProcessDiscrete madpd;
  int NRSTATES;
  int NRAGENTS;
  allocator<char> local_299;
  string local_298 [24];
  allocator<char> *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  allocator<char> local_239;
  string local_238 [32];
  MultiAgentDecisionProcessDiscrete local_218;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 2;
  local_10 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
            (&local_218,2,2,local_238,(string *)&stack0xfffffffffffffd90,local_298);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd8f);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  MultiAgentDecisionProcessDiscrete::~MultiAgentDecisionProcessDiscrete(&local_218);
  return;
}

Assistant:

void TestMADPconstructors(const ArgumentHandlers::Arguments& args)
{
    const int NRAGENTS = 2;
    const int NRSTATES = 2;
    MultiAgentDecisionProcessDiscrete madpd(NRAGENTS, NRSTATES);
}